

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

double __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_double
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  uint uVar1;
  ssize_t sVar2;
  size_t in_RCX;
  uint8_t *in_RDI;
  type_conflict7 tVar3;
  uint8_t buf_1 [8];
  uint8_t buf [4];
  uint8_t info;
  uint8_t b;
  double val;
  undefined4 in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffd0;
  undefined1 local_26 [4];
  byte local_22;
  uint8_t local_21;
  double local_20;
  double local_8;
  
  local_20 = 0.0;
  sVar2 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)&local_21,(void *)0x1,in_RCX);
  if (sVar2 == 0) {
    std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
    in_RDI[8] = '\0';
    local_8 = 0.0;
  }
  else {
    local_22 = get_additional_information_value(local_21);
    uVar1 = (uint)local_22;
    if (uVar1 == 0x1a) {
      sVar2 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)local_26,(void *)0x4,in_RCX);
      if (sVar2 != 4) {
        std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
        in_RDI[8] = '\0';
        return 0.0;
      }
      tVar3 = binary::big_to_native<float,jsoncons::detail::endian>
                        (in_RDI,CONCAT44(uVar1,in_stack_ffffffffffffffc0));
      local_20 = (double)tVar3;
    }
    else if (uVar1 == 0x1b) {
      sVar2 = bytes_source::read((bytes_source *)(in_RDI + 0x30),(int)&stack0xffffffffffffffd2,
                                 (void *)0x8,in_RCX);
      if (sVar2 != 8) {
        std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
        in_RDI[8] = '\0';
        return 0.0;
      }
      local_20 = binary::big_to_native<double,jsoncons::detail::endian>
                           (in_RDI,CONCAT44(uVar1,in_stack_ffffffffffffffc0));
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }